

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O0

int i2c_read_device(uint handle,char *buf,uint count)

{
  undefined8 in_RSI;
  int in_EDI;
  int bytes;
  int in_stack_00000ff8;
  int in_stack_00000ffc;
  void *in_stack_00001000;
  int local_18;
  int in_stack_fffffffffffffff8;
  
  local_18 = pigpio_command(bytes,in_EDI,in_stack_fffffffffffffff8,(int)((ulong)in_RSI >> 0x20),
                            (int)in_RSI);
  if (0 < local_18) {
    local_18 = recvMax(in_stack_00001000,in_stack_00000ffc,in_stack_00000ff8);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&command_mutex);
  return local_18;
}

Assistant:

int i2c_read_device(unsigned handle, char *buf, unsigned count)
{
   int bytes;

   bytes = pigpio_command(gPigCommand, PI_CMD_I2CRD, handle, count, 0);

   if (bytes > 0)
   {
      bytes = recvMax(buf, count, bytes);
   }

   pthread_mutex_unlock(&command_mutex);

   return bytes;
}